

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O0

void __thiscall
cppcms::session_pool::gc_job::gc_job(gc_job *this,service *ser,double freq,session_pool *pool)

{
  deadline_timer *this_00;
  io_service *this_01;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  deadline_timer *in_stack_ffffffffffffffa8;
  
  std::enable_shared_from_this<cppcms::session_pool::gc_job>::enable_shared_from_this
            ((enable_shared_from_this<cppcms::session_pool::gc_job> *)0x432ca8);
  this_00 = (deadline_timer *)operator_new(0x28);
  this_01 = service::get_io_service((service *)0x432cd1);
  booster::aio::deadline_timer::deadline_timer(this_00,this_01);
  std::shared_ptr<booster::aio::deadline_timer>::shared_ptr<booster::aio::deadline_timer,void>
            ((shared_ptr<booster::aio::deadline_timer> *)this_01,in_stack_ffffffffffffffa8);
  *(undefined8 *)(in_RDI + 0x20) = in_RSI;
  *(undefined8 *)(in_RDI + 0x28) = in_XMM0_Qa;
  *(undefined8 *)(in_RDI + 0x30) = in_RDX;
  return;
}

Assistant:

gc_job(service *ser,double freq,session_pool *pool) :
		timer_(new booster::aio::deadline_timer(ser->get_io_service())),
		service_(ser),
		freq_(freq),
		pool_(pool)
	{
	}